

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_statemachine(Curl_easy *data,connectdata *conn)

{
  anon_union_248_5_a113b5f6_for_proto *pp;
  int *piVar1;
  undefined1 *puVar2;
  byte *pbVar3;
  char cVar4;
  uchar uVar5;
  ftpstate instate;
  curl_usessl cVar6;
  FTP *pFVar7;
  FILEPROTO *pFVar8;
  ulong uVar9;
  ulong uVar10;
  Curl_addrinfo *hostname;
  undefined8 uVar11;
  byte bVar12;
  CURLcode CVar13;
  int iVar14;
  char *pcVar15;
  size_t len;
  time_t tVar16;
  long lVar17;
  char *pcVar18;
  char (*pacVar19) [4];
  ftpstate instate_00;
  long lVar20;
  ftpport fcmd;
  char *pcVar21;
  curl_off_t cVar22;
  connectdata *pcVar23;
  size_t *size_00;
  uint uVar24;
  byte *pbVar25;
  connectdata *conn_1;
  bool bVar26;
  undefined4 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int year;
  undefined1 auStack_19c [4];
  size_t nread;
  int ftpcode;
  int second;
  int minute;
  int hour;
  int day;
  int month;
  curl_off_t filesize;
  uint local_170;
  uint local_16c;
  int local_168;
  int local_164;
  int local_160;
  connectdata *local_140;
  curl_off_t size;
  undefined8 uStack_130;
  undefined8 local_128;
  
  nread = 0;
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar13 = Curl_pp_flushsend(data,&(pp->ftpc).pp);
    return CVar13;
  }
  size_00 = &nread;
  CVar13 = ftp_readresp(data,conn->sock[0],&(pp->ftpc).pp,&ftpcode,size_00);
  if (CVar13 != CURLE_OK) {
    return CVar13;
  }
  if (ftpcode == 0) {
    return CURLE_OK;
  }
  instate = (conn->proto).ftpc.state;
  switch(instate) {
  case FTP_WAIT220:
    if (ftpcode == 0xdc) {
      if ((data->set).use_ssl == CURLUSESSL_NONE) goto LAB_0045ae0d;
    }
    else {
      if (ftpcode != 0xe6) {
        Curl_failf(data,"Got a %03d ftp-server response when 220 was expected",(ulong)(uint)ftpcode)
        ;
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if (((data->set).use_ssl < CURLUSESSL_CONTROL) || (((conn->bits).field_0x6 & 0x20) != 0)) {
        ftpcode = 0xe6;
        goto LAB_0045a09a;
      }
    }
    if (((conn->bits).field_0x6 & 0x20) == 0) {
      (conn->proto).ftpc.count3 = 0;
      bVar12 = (data->set).ftpsslauth;
      if (2 < bVar12) {
        Curl_failf(data,"unsupported parameter to CURLOPT_FTPSSLAUTH: %d");
        return CURLE_UNKNOWN_OPTION;
      }
      iVar14 = *(int *)(&DAT_006066d0 + (uint)bVar12 * 4);
      lVar17 = *(long *)(&DAT_006066e0 + (ulong)(uint)bVar12 * 8);
      (conn->proto).ftpc.count2 = *(int *)(&DAT_006066c4 + (uint)bVar12 * 4);
      (conn->proto).ftpc.count1 = iVar14;
      CVar13 = Curl_pp_sendf(data,&(pp->ftpc).pp,"AUTH %s",ftp_statemachine::ftpauth + lVar17);
      if (CVar13 == CURLE_OK) {
        (data->conn->proto).ftpc.state = FTP_AUTH;
        return CURLE_OK;
      }
      return CVar13;
    }
LAB_0045ae0d:
    CVar13 = ftp_state_user(data,conn);
    return CVar13;
  case FTP_AUTH:
    if ((conn->proto).ftpc.pp.cache_size != 0) {
      return CURLE_WEIRD_SERVER_REPLY;
    }
    if ((ftpcode == 0x14e) || (ftpcode == 0xea)) {
      CVar13 = Curl_ssl_connect(data,conn,0);
      if (CVar13 != CURLE_OK) {
        return CVar13;
      }
      *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xffcfffff | 0x200000;
      goto LAB_0045ae0d;
    }
    iVar14 = (conn->proto).ftpc.count3;
    if (0 < iVar14) {
      if (CURLUSESSL_TRY < (data->set).use_ssl) {
        return CURLE_USE_SSL_FAILED;
      }
      goto LAB_0045ae0d;
    }
    (conn->proto).ftpc.count3 = iVar14 + 1;
    lVar17 = (long)(conn->proto).ftpc.count1 + (long)(conn->proto).ftpc.count2;
    (conn->proto).ftpc.count1 = (int)lVar17;
    pacVar19 = ftp_statemachine::ftpauth + lVar17;
    pcVar21 = "AUTH %s";
    goto LAB_0045a7cc;
  case FTP_USER:
  case FTP_PASS:
LAB_0045a09a:
    CVar13 = ftp_state_user_resp(data,ftpcode,instate_00);
    break;
  case FTP_ACCT:
    if (ftpcode == 0xe6) {
      CVar13 = ftp_state_loggedin(data);
    }
    else {
      Curl_failf(data,"ACCT rejected by server: %03d",(ulong)(uint)ftpcode);
      CVar13 = CURLE_FTP_WEIRD_PASS_REPLY;
    }
    break;
  case FTP_PBSZ:
    uVar11 = 0x50;
    if ((data->set).use_ssl == CURLUSESSL_CONTROL) {
      uVar11 = 0x43;
    }
    CVar13 = Curl_pp_sendf(data,&(pp->ftpc).pp,"PROT %c",uVar11);
    if (CVar13 == CURLE_OK) {
      (data->conn->proto).ftpc.state = FTP_PROT;
      CVar13 = CURLE_OK;
    }
    break;
  case FTP_PROT:
    cVar6 = (data->set).use_ssl;
    if (ftpcode - 200U < 100) {
      *(uint *)&(conn->bits).field_0x4 =
           *(uint *)&(conn->bits).field_0x4 & 0xffefffff |
           (uint)(cVar6 != CURLUSESSL_CONTROL) << 0x14;
    }
    else if (CURLUSESSL_CONTROL < cVar6) {
      return CURLE_USE_SSL_FAILED;
    }
    if ((data->set).ftp_ccc != '\0') {
      CVar13 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","CCC");
      if (CVar13 == CURLE_OK) {
        (data->conn->proto).ftpc.state = FTP_CCC;
        return CURLE_OK;
      }
      return CVar13;
    }
    goto LAB_0045a959;
  case FTP_CCC:
    if ((ftpcode < 500) && (CVar13 = Curl_ssl_shutdown(data,conn,0), CVar13 != CURLE_OK)) {
      Curl_failf(data,"Failed to clear the command channel (CCC)");
      return CVar13;
    }
LAB_0045a959:
    CVar13 = ftp_state_pwd(data,conn);
    break;
  case FTP_PWD:
    if (ftpcode == 0x101) {
      pcVar21 = (data->state).buffer;
      uVar24 = (data->set).buffer_size;
      pcVar18 = (char *)(*Curl_cmalloc)(nread + 1);
      if (pcVar18 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      for (pcVar21 = pcVar21 + 4; cVar4 = *pcVar21, pcVar15 = pcVar18,
          pcVar21 < (data->state).buffer + uVar24; pcVar21 = pcVar21 + 1) {
        if ((cVar4 == '\0') || (cVar4 == '\n')) goto LAB_0045b063;
        if (cVar4 == '\"') goto LAB_0045af35;
      }
      if (cVar4 == '\"') {
LAB_0045af35:
        do {
          cVar4 = pcVar21[1];
          if (cVar4 == '\"') {
            if (pcVar21[2] != '\"') {
              *pcVar15 = '\0';
              if (((conn->proto).ftpc.server_os != (char *)0x0) || (*pcVar18 == '/')) {
                (*Curl_cfree)((conn->proto).ftpc.entrypath);
                (conn->proto).ftpc.entrypath = pcVar18;
                Curl_infof(data,"Entry path is \'%s\'",pcVar18);
                (data->state).most_recent_ftp_entrypath = (conn->proto).ftpc.entrypath;
                goto switchD_00459fa3_default;
              }
              CVar13 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","SYST");
              if (CVar13 == CURLE_OK) {
                (*Curl_cfree)((conn->proto).ftpc.entrypath);
                (conn->proto).ftpc.entrypath = pcVar18;
                Curl_infof(data,"Entry path is \'%s\'",pcVar18);
                (data->state).most_recent_ftp_entrypath = (conn->proto).ftpc.entrypath;
                (data->conn->proto).ftpc.state = FTP_SYST;
                return CURLE_OK;
              }
              goto LAB_0045ad16;
            }
            pcVar21 = pcVar21 + 2;
          }
          else {
            if (cVar4 == '\0') goto LAB_0045b060;
            pcVar21 = pcVar21 + 1;
          }
          *pcVar15 = cVar4;
          pcVar15 = pcVar15 + 1;
        } while( true );
      }
      goto LAB_0045b063;
    }
  default:
switchD_00459fa3_default:
    (data->conn->proto).ftpc.state = FTP_STOP;
    CVar13 = CURLE_OK;
    break;
  case FTP_SYST:
    if (ftpcode == 0xd7) {
      pcVar21 = (data->state).buffer;
      pcVar18 = (char *)(*Curl_cmalloc)(nread + 1);
      if (pcVar18 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pbVar25 = (byte *)(pcVar21 + 4);
      do {
        bVar12 = *pbVar25;
        pbVar25 = pbVar25 + 1;
      } while (bVar12 == 0x20);
      lVar17 = 0;
      while ((bVar12 & 0xdf) != 0) {
        pcVar18[lVar17] = bVar12;
        pbVar3 = pbVar25 + lVar17;
        lVar17 = lVar17 + 1;
        bVar12 = *pbVar3;
      }
      pcVar18[lVar17] = '\0';
      iVar14 = Curl_strcasecompare(pcVar18,"OS/400");
      if (iVar14 != 0) {
        CVar13 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","SITE NAMEFMT 1");
        if (CVar13 == CURLE_OK) {
          (*Curl_cfree)((conn->proto).ftpc.server_os);
          (conn->proto).ftpc.server_os = pcVar18;
          (data->conn->proto).ftpc.state = FTP_NAMEFMT;
          return CURLE_OK;
        }
LAB_0045ad16:
        (*Curl_cfree)(pcVar18);
        return CVar13;
      }
      (*Curl_cfree)((conn->proto).ftpc.server_os);
      (conn->proto).ftpc.server_os = pcVar18;
    }
    goto switchD_00459fa3_default;
  case FTP_NAMEFMT:
    if (ftpcode == 0xfa) {
      ftp_state_pwd(data,conn);
      return CURLE_OK;
    }
    goto switchD_00459fa3_default;
  case FTP_QUOTE:
  case FTP_RETR_PREQUOTE:
  case FTP_STOR_PREQUOTE:
  case FTP_POSTQUOTE:
    if ((ftpcode < 400) || ((conn->proto).ftpc.count2 != 0)) {
      CVar13 = ftp_state_quote(data,false,instate);
    }
    else {
      Curl_failf(data,"QUOT command failed with %03d",(ulong)(uint)ftpcode);
      CVar13 = CURLE_QUOTE_ERROR;
    }
    break;
  case FTP_CWD:
    if (99 < ftpcode - 200U) {
      uVar5 = (data->set).ftp_create_missing_dirs;
      if (((uVar5 != '\0') && (lVar17 = (long)(conn->proto).ftpc.cwdcount, lVar17 != 0)) &&
         ((conn->proto).ftpc.count2 == 0)) {
        (conn->proto).ftpc.count2 = 1;
        *(uint *)((long)&conn->proto + 0xcc) = (uint)(uVar5 == '\x02');
        CVar13 = Curl_pp_sendf(data,&(pp->ftpc).pp,"MKD %s",
                               *(undefined8 *)(((conn->proto).httpc.drain_total - 8) + lVar17 * 8));
        if (CVar13 == CURLE_OK) {
          (data->conn->proto).ftpc.state = FTP_MKD;
          return CURLE_OK;
        }
        return CVar13;
      }
      Curl_failf(data,"Server denied you to change to the given directory");
      (conn->proto).ftpc.cwdfail = true;
      return CURLE_REMOTE_ACCESS_DENIED;
    }
    (conn->proto).ftpc.count2 = 0;
    iVar14 = (conn->proto).ftpc.cwdcount;
    (conn->proto).ftpc.cwdcount = iVar14 + 1;
    if ((conn->proto).ftpc.dirdepth <= iVar14) {
      CVar13 = ftp_state_mdtm(data);
      return CVar13;
    }
    pacVar19 = (char (*) [4])(conn->proto).ftpc.dirs[iVar14];
    goto LAB_0045a7c5;
  case FTP_MKD:
    if (99 < ftpcode - 200U) {
      piVar1 = &(conn->proto).ftpc.count3;
      iVar14 = *piVar1;
      *piVar1 = *piVar1 + -1;
      if (iVar14 == 0) {
        Curl_failf(data,"Failed to MKD dir: %03d",(ulong)(uint)ftpcode);
        return CURLE_REMOTE_ACCESS_DENIED;
      }
    }
    (data->conn->proto).ftpc.state = FTP_CWD;
    pacVar19 = *(char (**) [4])
                (((conn->proto).httpc.drain_total - 8) + (long)(conn->proto).ftpc.cwdcount * 8);
LAB_0045a7c5:
    pcVar21 = "CWD %s";
LAB_0045a7cc:
    CVar13 = Curl_pp_sendf(data,&(pp->ftpc).pp,pcVar21,pacVar19);
    break;
  case FTP_MDTM:
    pFVar8 = (data->req).p.file;
    if (ftpcode == 0x226) {
      pcVar21 = "MDTM failed: file does not exist or permission problem, continuing";
LAB_0045ac63:
      Curl_infof(data,pcVar21);
    }
    else {
      if (ftpcode != 0xd5) {
        pcVar21 = "unsupported MDTM reply format";
        goto LAB_0045ac63;
      }
      pcVar23 = data->conn;
      iVar14 = __isoc99_sscanf((data->state).buffer + 4,"%04d%02d%02d%02d%02d%02d",&year,&month,&day
                               ,&hour,&minute,&second);
      if (iVar14 == 6) {
        curl_msnprintf((char *)&size,0x18,"%04d%02d%02d %02d:%02d:%02d GMT",_year & 0xffffffff,
                       (ulong)(uint)month,(ulong)(uint)day,(ulong)(uint)hour,(ulong)(uint)minute,
                       (ulong)(uint)second);
        tVar16 = Curl_getdate_capped((char *)&size);
        (data->info).filetime = tVar16;
      }
      uVar9 = *(ulong *)&(data->set).field_0x8e2;
      if ((((((uint)uVar9 >> 0x19 & 1) != 0) && ((uVar9 & 0x20) != 0)) &&
          ((pcVar23->proto).ftpc.file != (char *)0x0)) &&
         (lVar17 = (data->info).filetime, -1 < lVar17)) {
        CVar13 = Curl_gmtime(lVar17,(tm *)&filesize);
        if (CVar13 != CURLE_OK) {
          return CVar13;
        }
        iVar14 = 6;
        if (local_160 != 0) {
          iVar14 = local_160 + -1;
        }
        iVar14 = curl_msnprintf((char *)&size,0x80,
                                "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                                Curl_wkday[iVar14],(ulong)local_16c,Curl_month[local_168],
                                (ulong)(local_164 + 0x76c),(ulong)local_170,(ulong)filesize >> 0x20,
                                filesize & 0xffffffff);
        CVar13 = Curl_client_write(data,3,(char *)&size,(long)iVar14);
        if (CVar13 != CURLE_OK) {
          return CVar13;
        }
      }
    }
    uVar5 = (data->set).timecondition;
    if (uVar5 != '\0') {
      uVar9 = (data->info).filetime;
      if (((long)uVar9 < 1) || (uVar10 = (data->set).timevalue, (long)uVar10 < 1)) {
        Curl_infof(data,"Skipping time comparison");
      }
      else if (uVar5 == '\x02') {
        if (uVar10 < uVar9) {
          pcVar21 = "The requested document is not old enough";
LAB_0045aef9:
          Curl_infof(data,pcVar21);
          pFVar8->fd = 2;
          puVar2 = &(data->info).field_0xec;
          *puVar2 = *puVar2 | 1;
          goto switchD_00459fa3_default;
        }
      }
      else if (uVar9 <= uVar10) {
        pcVar21 = "The requested document is not new enough";
        goto LAB_0045aef9;
      }
    }
    CVar13 = ftp_state_type(data);
    break;
  case FTP_TYPE:
  case FTP_LIST_TYPE:
  case FTP_RETR_TYPE:
  case FTP_STOR_TYPE:
    CVar13 = ftp_state_type_resp(data,ftpcode,instate);
    break;
  case FTP_SIZE:
  case FTP_RETR_SIZE:
  case FTP_STOR_SIZE:
    filesize = -1;
    if (ftpcode == 0xd5) {
      pcVar18 = (data->state).buffer + 4;
      pcVar21 = strchr(pcVar18,0xd);
      if (pcVar21 != (char *)0x0) {
        pcVar21 = pcVar21 + -1;
        do {
          cVar4 = *pcVar21;
          pcVar15 = pcVar21 + -1;
          if (pcVar21 <= pcVar18) break;
          pcVar21 = pcVar15;
        } while ((byte)(cVar4 - 0x30U) < 10);
        pcVar18 = pcVar15 + (2 - (ulong)((byte)(cVar4 - 0x30U) < 10));
      }
      curlx_strtoofft(pcVar18,(char **)0x0,0,&filesize);
    }
    else if (instate != FTP_STOR_SIZE && ftpcode == 0x226) {
      Curl_failf(data,"The file does not exist");
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
    if (instate == FTP_STOR_SIZE) {
      (data->state).resume_from = filesize;
      CVar13 = ftp_state_ul_setup(data,true);
    }
    else if (instate == FTP_RETR_SIZE) {
      Curl_pgrsSetDownloadSize(data,filesize);
      CVar13 = ftp_state_retr(data,filesize);
    }
    else {
      CVar13 = CURLE_OK;
      if (instate == FTP_SIZE) {
        if (filesize == -1) {
          cVar22 = -1;
        }
        else {
          iVar14 = curl_msnprintf((char *)&size,0x80,"Content-Length: %ld\r\n");
          CVar13 = Curl_client_write(data,3,(char *)&size,(long)iVar14);
          cVar22 = filesize;
          if (CVar13 != CURLE_OK) {
            return CVar13;
          }
        }
        Curl_pgrsSetDownloadSize(data,cVar22);
        CVar13 = ftp_state_rest(data,data->conn);
      }
    }
    break;
  case FTP_REST:
  case FTP_RETR_REST:
    if (instate == FTP_RETR_REST) {
      if (ftpcode == 0x15e) {
        CVar13 = Curl_pp_sendf(data,&(pp->ftpc).pp,"RETR %s",(conn->proto).ftpc.file);
        if (CVar13 == CURLE_OK) {
          (data->conn->proto).ftpc.state = FTP_RETR;
          CVar13 = CURLE_OK;
        }
      }
      else {
        Curl_failf(data,"Couldn\'t use REST");
        CVar13 = CURLE_FTP_COULDNT_USE_REST;
      }
    }
    else {
      if (ftpcode == 0x15e) {
        size._0_1_ = 'A';
        size._1_1_ = 'c';
        size._2_1_ = 'c';
        size._3_1_ = 'e';
        size._4_1_ = 'p';
        size._5_1_ = 't';
        size._6_1_ = '-';
        size._7_1_ = 'r';
        uStack_130._0_1_ = 'a';
        uStack_130._1_1_ = 'n';
        uStack_130._2_1_ = 'g';
        uStack_130._3_1_ = 'e';
        uStack_130._4_1_ = 's';
        uStack_130._5_1_ = ':';
        uStack_130._6_1_ = ' ';
        uStack_130._7_1_ = 'b';
        local_128 = 0xa0d73657479;
        len = strlen((char *)&size);
        CVar13 = Curl_client_write(data,3,(char *)&size,len);
        if (CVar13 != CURLE_OK) {
          return CVar13;
        }
      }
      CVar13 = ftp_state_prepare_transfer(data);
    }
    break;
  case FTP_PORT:
    if (ftpcode - 200U < 100) {
      Curl_infof(data,"Connect data stream actively");
      (data->conn->proto).ftpc.state = FTP_STOP;
      CVar13 = ftp_dophase_done(data,false);
    }
    else {
      pcVar23 = data->conn;
      iVar14 = (pcVar23->proto).ftpc.count1;
      if (iVar14 == 0) {
        Curl_infof(data,"disabling EPRT usage");
        puVar2 = &(pcVar23->bits).field_0x6;
        *puVar2 = *puVar2 & 0xf7;
        fcmd = PORT;
      }
      else {
        fcmd = iVar14 + PORT;
        if (fcmd == DONE) {
          Curl_failf(data,"Failed to do PORT");
          return CURLE_FTP_PORT_FAILED;
        }
      }
      CVar13 = ftp_state_use_port(data,fcmd);
    }
    break;
  case FTP_PRET:
    if (ftpcode == 200) {
      CVar13 = ftp_state_use_pasv(data,conn);
    }
    else {
      Curl_failf(data,"PRET command not accepted: %03d",(ulong)(uint)ftpcode);
      CVar13 = CURLE_FTP_PRET_FAILED;
    }
    break;
  case FTP_PASV:
    pcVar23 = data->conn;
    filesize = 0;
    pcVar21 = (data->state).buffer + 4;
    (*Curl_cfree)((pcVar23->proto).ftpc.newhost);
    (pcVar23->proto).ftpc.newhost = (char *)0x0;
    iVar14 = (pcVar23->proto).ftpc.count1;
    if (ftpcode == 0xe5 && iVar14 == 0) {
      pcVar21 = strchr(pcVar21,0x28);
      if ((pcVar21 == (char *)0x0) ||
         (iVar14 = __isoc99_sscanf(pcVar21 + 1,"%c%c%c%u%c",&year,(long)&year + 1,(long)&year + 2,
                                   &size,(long)&year + 3), iVar14 != 5)) {
LAB_0045a78e:
        pcVar21 = "Weirdly formatted EPSV reply";
      }
      else {
        lVar17 = 1;
        do {
          if (lVar17 == 4) {
            if (0xffff < (uint)size) goto LAB_0045af71;
            (pcVar23->proto).ftpc.newport = (unsigned_short)size;
            if (((pcVar23->bits).field_0x4 & 10) == 0) {
              pcVar21 = pcVar23->primary_ip;
            }
            else {
              pcVar21 = (pcVar23->host).name;
            }
            pcVar21 = (*Curl_cstrdup)(pcVar21);
            (pcVar23->proto).ftpc.newhost = pcVar21;
            if (pcVar21 == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            goto LAB_0045b1a2;
          }
          lVar20 = lVar17 + -4;
          lVar17 = lVar17 + 1;
        } while (auStack_19c[lVar20] == (char)year);
        if ((uint)size < 0x10000) goto LAB_0045a78e;
LAB_0045af71:
        pcVar21 = "Illegal port number in EPSV reply";
      }
      Curl_failf(data,pcVar21);
    }
    else {
      if (ftpcode == 0xe3 && iVar14 == 1) {
        size = 0;
        uStack_130 = 0;
        _year = 0;
        local_140 = pcVar23;
        for (; uVar27 = SUB84(size_00,0), *pcVar21 != '\0'; pcVar21 = pcVar21 + 1) {
          size_00 = &uStack_130;
          iVar14 = __isoc99_sscanf(pcVar21,"%u,%u,%u,%u,%u,%u",&size,(long)&size + 4,size_00,
                                   (long)&uStack_130 + 4,&year,auStack_19c);
          uVar27 = SUB84(size_00,0);
          if (iVar14 == 6) {
            bVar26 = *pcVar21 == '\0';
            goto LAB_0045ae25;
          }
        }
        bVar26 = true;
LAB_0045ae25:
        pcVar23 = local_140;
        auVar28._8_8_ = _year;
        auVar28._0_8_ = uStack_130;
        auVar28 = auVar28 ^ _DAT_006065b0;
        auVar29._0_4_ = -(uint)(-0x7fffff01 < auVar28._0_4_);
        auVar29._4_4_ = -(uint)(-0x7fffff01 < auVar28._4_4_);
        auVar29._8_4_ = -(uint)(-0x7fffff01 < auVar28._8_4_);
        auVar29._12_4_ = -(uint)(-0x7fffff01 < auVar28._12_4_);
        iVar14 = movmskps(uVar27,auVar29);
        if ((bool)(0xff < (uint)size | bVar26 | 0xff < size._4_4_ | iVar14 != 0)) {
          Curl_failf(data,"Couldn\'t interpret the 227-response");
          return CURLE_FTP_WEIRD_227_FORMAT;
        }
        uVar27 = (undefined4)(uStack_130 >> 0x20);
        if (((data->set).field_0x8e3 & 0x40) == 0) {
          pcVar21 = curl_maprintf("%u.%u.%u.%u",size & 0xffffffff,(ulong)size._4_4_,
                                  uStack_130 & 0xffffffff,uVar27);
        }
        else {
          Curl_infof(data,"Skip %u.%u.%u.%u for data connection, re-use %s instead",
                     size & 0xffffffff,(ulong)size._4_4_,uStack_130 & 0xffffffff,uVar27,
                     (local_140->host).name);
          if (((pcVar23->bits).field_0x4 & 10) == 0) {
            pcVar21 = pcVar23->primary_ip;
          }
          else {
            pcVar21 = (pcVar23->host).name;
          }
          pcVar21 = (*Curl_cstrdup)(pcVar21);
        }
        (pcVar23->proto).ftpc.newhost = pcVar21;
        if (pcVar21 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (pcVar23->proto).ftpc.newport = (short)(year << 8) + (short)(_year >> 0x20);
LAB_0045b1a2:
        uVar24 = *(uint *)&(pcVar23->bits).field_0x4;
        if ((uVar24 & 0x20) == 0) {
          if (((uVar24 & 0x2000080) == 0x2000000) && (*pcVar21 == '\0')) {
            Curl_conninfo_remote(data,pcVar23,pcVar23->sock[0]);
            (*Curl_cfree)((pcVar23->proto).ftpc.newhost);
            (pcVar23->proto).ftpc.newhost = (char *)0x0;
            if (((pcVar23->bits).field_0x4 & 10) == 0) {
              pcVar21 = pcVar23->primary_ip;
            }
            else {
              pcVar21 = (pcVar23->host).name;
            }
            pcVar21 = (*Curl_cstrdup)(pcVar21);
            (pcVar23->proto).ftpc.newhost = pcVar21;
            if (pcVar21 == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
          }
          Curl_resolv(data,pcVar21,(uint)(pcVar23->proto).ftpc.newport,false,
                      (Curl_dns_entry **)&filesize);
          uVar24 = (uint)(pcVar23->proto).ftpc.newport;
          if (filesize == 0) {
            Curl_failf(data,"Can\'t resolve new host %s:%hu",(pcVar23->proto).ftpc.newhost,
                       (ulong)uVar24);
            return CURLE_FTP_CANT_GET_HOST;
          }
        }
        else {
          hostname = pcVar23->tempaddr[(ulong)((uVar24 & 2) == 0) * 8 + 0xe];
          Curl_resolv(data,(char *)hostname,pcVar23->port,false,(Curl_dns_entry **)&filesize);
          uVar24 = pcVar23->port;
          if (filesize == 0) {
            Curl_failf(data,"Can\'t resolve proxy host %s:%hu",hostname,(ulong)(uVar24 & 0xffff));
            return CURLE_COULDNT_RESOLVE_PROXY;
          }
        }
        (pcVar23->bits).tcpconnect[1] = false;
        CVar13 = Curl_connecthost(data,pcVar23,(Curl_dns_entry *)filesize);
        if (CVar13 == CURLE_OK) {
          if (((data->set).field_0x8e5 & 8) != 0) {
            pcVar21 = (pcVar23->proto).ftpc.newhost;
            Curl_printable_address(*(Curl_addrinfo **)filesize,(char *)&size,0x100);
            Curl_infof(data,"Connecting to %s (%s) port %d",pcVar21,&size,(ulong)(uVar24 & 0xffff));
          }
          Curl_resolv_unlock(data,(Curl_dns_entry *)filesize);
          (*Curl_cfree)(pcVar23->secondaryhostname);
          pcVar23->secondaryhostname = (char *)0x0;
          pcVar23->secondary_port = (pcVar23->proto).ftpc.newport;
          pcVar21 = (*Curl_cstrdup)((pcVar23->proto).ftpc.newhost);
          pcVar23->secondaryhostname = pcVar21;
          if (pcVar21 == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          puVar2 = &(pcVar23->bits).field_0x5;
          *puVar2 = *puVar2 | 0x20;
          (data->conn->proto).ftpc.state = FTP_STOP;
          return CURLE_OK;
        }
        Curl_resolv_unlock(data,(Curl_dns_entry *)filesize);
        if (ftpcode != 0xe5) {
          return CVar13;
        }
        if ((pcVar23->proto).ftpc.count1 != 0) {
          return CVar13;
        }
LAB_0045af1f:
        CVar13 = ftp_epsv_disable(data,pcVar23);
        return CVar13;
      }
      if (iVar14 == 0) goto LAB_0045af1f;
      Curl_failf(data,"Bad PASV/EPSV response: %03d",(ulong)(uint)ftpcode);
    }
    CVar13 = CURLE_FTP_WEIRD_PASV_REPLY;
    break;
  case FTP_LIST:
  case FTP_RETR:
    pcVar23 = data->conn;
    pFVar7 = (data->req).p.ftp;
    if ((ftpcode != 0x96) && (ftpcode != 0x7d)) {
      if (ftpcode == 0x1c2 && instate == FTP_LIST) {
        pFVar7->transfer = PPTRANSFER_NONE;
        (pcVar23->proto).ftpc.state = FTP_STOP;
        return CURLE_OK;
      }
      Curl_failf(data,"RETR response: %03d",(ulong)(uint)ftpcode);
      if (ftpcode == 0x226 && instate == FTP_RETR) {
        return CURLE_REMOTE_FILE_NOT_FOUND;
      }
      return CURLE_FTP_COULDNT_RETR_FILE;
    }
    size = -1;
    if (((instate == FTP_LIST) || (((data->state).field_0x6d1 & 0x80) != 0)) ||
       (0 < pFVar7->downloadsize)) {
      lVar17 = pFVar7->downloadsize;
      cVar22 = lVar17;
      if (lVar17 < 0) {
        lVar17 = -1;
        cVar22 = size;
      }
    }
    else {
      pcVar21 = (data->state).buffer;
      pcVar18 = strstr(pcVar21," bytes");
      lVar17 = -1;
      cVar22 = size;
      if (pcVar18 != (char *)0x0) {
        pcVar21 = pcVar21 + (2 - (long)pcVar18);
        for (; (pcVar21 != (char *)0x0 && (pcVar18[-1] != '(')); pcVar18 = pcVar18 + -1) {
          lVar17 = -1;
          if (9 < (byte)(pcVar18[-1] - 0x30U)) goto LAB_0045aa76;
          pcVar21 = pcVar21 + 1;
        }
        curlx_strtoofft(pcVar18,(char **)0x0,0,&size);
        lVar17 = size;
        cVar22 = size;
      }
    }
LAB_0045aa76:
    size = cVar22;
    lVar20 = (data->req).maxdownload;
    if (lVar20 < 1 || lVar17 <= lVar20) {
      if (instate != FTP_LIST) {
        if (((data->state).field_0x6d1 & 0x80) != 0) {
          size = -1;
        }
        goto LAB_0045aa99;
      }
      pcVar21 = "Maxdownload = %ld";
LAB_0045aacf:
      Curl_infof(data,pcVar21,lVar20);
    }
    else {
      (data->req).size = lVar20;
      size = lVar20;
LAB_0045aa99:
      Curl_infof(data,"Maxdownload = %ld");
      if (instate != FTP_LIST) {
        pcVar21 = "Getting file with size: %ld";
        lVar20 = size;
        goto LAB_0045aacf;
      }
    }
    (pcVar23->proto).ftpc.state_saved = instate;
    (pcVar23->proto).ftpc.retr_size_saved = size;
    if (((data->set).field_0x8e3 & 4) != 0) {
      CVar13 = AllowServerConnect(data,(_Bool *)&filesize);
      if (CVar13 != CURLE_OK) {
        return CVar13;
      }
      if ((char)filesize == '\0') {
        Curl_infof(data,"Data conn was not available immediately");
        (data->conn->proto).ftpc.state = FTP_STOP;
        (pcVar23->proto).ftpc.wait_data_conn = true;
        return CURLE_OK;
      }
      return CURLE_OK;
    }
    goto LAB_0045aaf5;
  case FTP_STOR:
    if (399 < ftpcode) {
      Curl_failf(data,"Failed FTP upload: %0d",(ulong)(uint)ftpcode);
      (data->conn->proto).ftpc.state = FTP_STOP;
      return CURLE_UPLOAD_FAILED;
    }
    pcVar23 = data->conn;
    (pcVar23->proto).ftpc.state_saved = FTP_STOR;
    if (((data->set).field_0x8e3 & 4) != 0) {
      (data->conn->proto).ftpc.state = FTP_STOP;
      CVar13 = AllowServerConnect(data,(_Bool *)&size);
      if (CVar13 != CURLE_OK) {
        return CVar13;
      }
      if ((char)size == '\0') {
        Curl_infof(data,"Data conn was not available immediately");
        (pcVar23->proto).ftpc.wait_data_conn = true;
        return CURLE_OK;
      }
      return CURLE_OK;
    }
LAB_0045aaf5:
    CVar13 = InitiateTransfer(data);
  }
  return CVar13;
LAB_0045b060:
  *pcVar15 = '\0';
LAB_0045b063:
  (*Curl_cfree)(pcVar18);
  Curl_infof(data,"Failed to figure out path");
  goto switchD_00459fa3_default;
}

Assistant:

static CURLcode ftp_statemachine(struct Curl_easy *data,
                                 struct connectdata *conn)
{
  CURLcode result;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int ftpcode;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  static const char ftpauth[][4]  = { "SSL", "TLS" };
  size_t nread = 0;

  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

  result = ftp_readresp(data, sock, pp, &ftpcode, &nread);
  if(result)
    return result;

  if(ftpcode) {
    /* we have now received a full FTP server response */
    switch(ftpc->state) {
    case FTP_WAIT220:
      if(ftpcode == 230) {
        /* 230 User logged in - already! Take as 220 if TLS required. */
        if(data->set.use_ssl <= CURLUSESSL_TRY ||
           conn->bits.ftp_use_control_ssl)
          return ftp_state_user_resp(data, ftpcode, ftpc->state);
      }
      else if(ftpcode != 220) {
        failf(data, "Got a %03d ftp-server response when 220 was expected",
              ftpcode);
        return CURLE_WEIRD_SERVER_REPLY;
      }

      /* We have received a 220 response fine, now we proceed. */
#ifdef HAVE_GSSAPI
      if(data->set.krb) {
        /* If not anonymous login, try a secure login. Note that this
           procedure is still BLOCKING. */

        Curl_sec_request_prot(conn, "private");
        /* We set private first as default, in case the line below fails to
           set a valid level */
        Curl_sec_request_prot(conn, data->set.str[STRING_KRB_LEVEL]);

        if(Curl_sec_login(data, conn)) {
          failf(data, "secure login failed");
          return CURLE_WEIRD_SERVER_REPLY;
        }
        infof(data, "Authentication successful");
      }
#endif

      if(data->set.use_ssl && !conn->bits.ftp_use_control_ssl) {
        /* We don't have a SSL/TLS control connection yet, but FTPS is
           requested. Try a FTPS connection now */

        ftpc->count3 = 0;
        switch(data->set.ftpsslauth) {
        case CURLFTPAUTH_DEFAULT:
        case CURLFTPAUTH_SSL:
          ftpc->count2 = 1; /* add one to get next */
          ftpc->count1 = 0;
          break;
        case CURLFTPAUTH_TLS:
          ftpc->count2 = -1; /* subtract one to get next */
          ftpc->count1 = 1;
          break;
        default:
          failf(data, "unsupported parameter to CURLOPT_FTPSSLAUTH: %d",
                (int)data->set.ftpsslauth);
          return CURLE_UNKNOWN_OPTION; /* we don't know what to do */
        }
        result = Curl_pp_sendf(data, &ftpc->pp, "AUTH %s",
                               ftpauth[ftpc->count1]);
        if(!result)
          state(data, FTP_AUTH);
      }
      else
        result = ftp_state_user(data, conn);
      break;

    case FTP_AUTH:
      /* we have gotten the response to a previous AUTH command */

      if(pp->cache_size)
        return CURLE_WEIRD_SERVER_REPLY; /* Forbid pipelining in response. */

      /* RFC2228 (page 5) says:
       *
       * If the server is willing to accept the named security mechanism,
       * and does not require any security data, it must respond with
       * reply code 234/334.
       */

      if((ftpcode == 234) || (ftpcode == 334)) {
        /* Curl_ssl_connect is BLOCKING */
        result = Curl_ssl_connect(data, conn, FIRSTSOCKET);
        if(!result) {
          conn->bits.ftp_use_data_ssl = FALSE; /* clear-text data */
          conn->bits.ftp_use_control_ssl = TRUE; /* SSL on control */
          result = ftp_state_user(data, conn);
        }
      }
      else if(ftpc->count3 < 1) {
        ftpc->count3++;
        ftpc->count1 += ftpc->count2; /* get next attempt */
        result = Curl_pp_sendf(data, &ftpc->pp, "AUTH %s",
                               ftpauth[ftpc->count1]);
        /* remain in this same state */
      }
      else {
        if(data->set.use_ssl > CURLUSESSL_TRY)
          /* we failed and CURLUSESSL_CONTROL or CURLUSESSL_ALL is set */
          result = CURLE_USE_SSL_FAILED;
        else
          /* ignore the failure and continue */
          result = ftp_state_user(data, conn);
      }
      break;

    case FTP_USER:
    case FTP_PASS:
      result = ftp_state_user_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_ACCT:
      result = ftp_state_acct_resp(data, ftpcode);
      break;

    case FTP_PBSZ:
      result =
        Curl_pp_sendf(data, &ftpc->pp, "PROT %c",
                      data->set.use_ssl == CURLUSESSL_CONTROL ? 'C' : 'P');
      if(!result)
        state(data, FTP_PROT);
      break;

    case FTP_PROT:
      if(ftpcode/100 == 2)
        /* We have enabled SSL for the data connection! */
        conn->bits.ftp_use_data_ssl =
          (data->set.use_ssl != CURLUSESSL_CONTROL) ? TRUE : FALSE;
      /* FTP servers typically responds with 500 if they decide to reject
         our 'P' request */
      else if(data->set.use_ssl > CURLUSESSL_CONTROL)
        /* we failed and bails out */
        return CURLE_USE_SSL_FAILED;

      if(data->set.ftp_ccc) {
        /* CCC - Clear Command Channel
         */
        result = Curl_pp_sendf(data, &ftpc->pp, "%s", "CCC");
        if(!result)
          state(data, FTP_CCC);
      }
      else
        result = ftp_state_pwd(data, conn);
      break;

    case FTP_CCC:
      if(ftpcode < 500) {
        /* First shut down the SSL layer (note: this call will block) */
        result = Curl_ssl_shutdown(data, conn, FIRSTSOCKET);

        if(result)
          failf(data, "Failed to clear the command channel (CCC)");
      }
      if(!result)
        /* Then continue as normal */
        result = ftp_state_pwd(data, conn);
      break;

    case FTP_PWD:
      if(ftpcode == 257) {
        char *ptr = &data->state.buffer[4];  /* start on the first letter */
        const size_t buf_size = data->set.buffer_size;
        char *dir;
        bool entry_extracted = FALSE;

        dir = malloc(nread + 1);
        if(!dir)
          return CURLE_OUT_OF_MEMORY;

        /* Reply format is like
           257<space>[rubbish]"<directory-name>"<space><commentary> and the
           RFC959 says

           The directory name can contain any character; embedded
           double-quotes should be escaped by double-quotes (the
           "quote-doubling" convention).
        */

        /* scan for the first double-quote for non-standard responses */
        while(ptr < &data->state.buffer[buf_size]
              && *ptr != '\n' && *ptr != '\0' && *ptr != '"')
          ptr++;

        if('\"' == *ptr) {
          /* it started good */
          char *store;
          ptr++;
          for(store = dir; *ptr;) {
            if('\"' == *ptr) {
              if('\"' == ptr[1]) {
                /* "quote-doubling" */
                *store = ptr[1];
                ptr++;
              }
              else {
                /* end of path */
                entry_extracted = TRUE;
                break; /* get out of this loop */
              }
            }
            else
              *store = *ptr;
            store++;
            ptr++;
          }
          *store = '\0'; /* null-terminate */
        }
        if(entry_extracted) {
          /* If the path name does not look like an absolute path (i.e.: it
             does not start with a '/'), we probably need some server-dependent
             adjustments. For example, this is the case when connecting to
             an OS400 FTP server: this server supports two name syntaxes,
             the default one being incompatible with standard paths. In
             addition, this server switches automatically to the regular path
             syntax when one is encountered in a command: this results in
             having an entrypath in the wrong syntax when later used in CWD.
               The method used here is to check the server OS: we do it only
             if the path name looks strange to minimize overhead on other
             systems. */

          if(!ftpc->server_os && dir[0] != '/') {
            result = Curl_pp_sendf(data, &ftpc->pp, "%s", "SYST");
            if(result) {
              free(dir);
              return result;
            }
            Curl_safefree(ftpc->entrypath);
            ftpc->entrypath = dir; /* remember this */
            infof(data, "Entry path is '%s'", ftpc->entrypath);
            /* also save it where getinfo can access it: */
            data->state.most_recent_ftp_entrypath = ftpc->entrypath;
            state(data, FTP_SYST);
            break;
          }

          Curl_safefree(ftpc->entrypath);
          ftpc->entrypath = dir; /* remember this */
          infof(data, "Entry path is '%s'", ftpc->entrypath);
          /* also save it where getinfo can access it: */
          data->state.most_recent_ftp_entrypath = ftpc->entrypath;
        }
        else {
          /* couldn't get the path */
          free(dir);
          infof(data, "Failed to figure out path");
        }
      }
      state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE"));
      break;

    case FTP_SYST:
      if(ftpcode == 215) {
        char *ptr = &data->state.buffer[4];  /* start on the first letter */
        char *os;
        char *store;

        os = malloc(nread + 1);
        if(!os)
          return CURLE_OUT_OF_MEMORY;

        /* Reply format is like
           215<space><OS-name><space><commentary>
        */
        while(*ptr == ' ')
          ptr++;
        for(store = os; *ptr && *ptr != ' ';)
          *store++ = *ptr++;
        *store = '\0'; /* null-terminate */

        /* Check for special servers here. */

        if(strcasecompare(os, "OS/400")) {
          /* Force OS400 name format 1. */
          result = Curl_pp_sendf(data, &ftpc->pp, "%s", "SITE NAMEFMT 1");
          if(result) {
            free(os);
            return result;
          }
          /* remember target server OS */
          Curl_safefree(ftpc->server_os);
          ftpc->server_os = os;
          state(data, FTP_NAMEFMT);
          break;
        }
        /* Nothing special for the target server. */
        /* remember target server OS */
        Curl_safefree(ftpc->server_os);
        ftpc->server_os = os;
      }
      else {
        /* Cannot identify server OS. Continue anyway and cross fingers. */
      }

      state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE"));
      break;

    case FTP_NAMEFMT:
      if(ftpcode == 250) {
        /* Name format change successful: reload initial path. */
        ftp_state_pwd(data, conn);
        break;
      }

      state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE"));
      break;

    case FTP_QUOTE:
    case FTP_POSTQUOTE:
    case FTP_RETR_PREQUOTE:
    case FTP_STOR_PREQUOTE:
      if((ftpcode >= 400) && !ftpc->count2) {
        /* failure response code, and not allowed to fail */
        failf(data, "QUOT command failed with %03d", ftpcode);
        result = CURLE_QUOTE_ERROR;
      }
      else
        result = ftp_state_quote(data, FALSE, ftpc->state);
      break;

    case FTP_CWD:
      if(ftpcode/100 != 2) {
        /* failure to CWD there */
        if(data->set.ftp_create_missing_dirs &&
           ftpc->cwdcount && !ftpc->count2) {
          /* try making it */
          ftpc->count2++; /* counter to prevent CWD-MKD loops */

          /* count3 is set to allow MKD to fail once per dir. In the case when
          CWD fails and then MKD fails (due to another session raced it to
          create the dir) this then allows for a second try to CWD to it. */
          ftpc->count3 = (data->set.ftp_create_missing_dirs == 2) ? 1 : 0;

          result = Curl_pp_sendf(data, &ftpc->pp, "MKD %s",
                                 ftpc->dirs[ftpc->cwdcount - 1]);
          if(!result)
            state(data, FTP_MKD);
        }
        else {
          /* return failure */
          failf(data, "Server denied you to change to the given directory");
          ftpc->cwdfail = TRUE; /* don't remember this path as we failed
                                   to enter it */
          result = CURLE_REMOTE_ACCESS_DENIED;
        }
      }
      else {
        /* success */
        ftpc->count2 = 0;
        if(++ftpc->cwdcount <= ftpc->dirdepth)
          /* send next CWD */
          result = Curl_pp_sendf(data, &ftpc->pp, "CWD %s",
                                 ftpc->dirs[ftpc->cwdcount - 1]);
        else
          result = ftp_state_mdtm(data);
      }
      break;

    case FTP_MKD:
      if((ftpcode/100 != 2) && !ftpc->count3--) {
        /* failure to MKD the dir */
        failf(data, "Failed to MKD dir: %03d", ftpcode);
        result = CURLE_REMOTE_ACCESS_DENIED;
      }
      else {
        state(data, FTP_CWD);
        /* send CWD */
        result = Curl_pp_sendf(data, &ftpc->pp, "CWD %s",
                               ftpc->dirs[ftpc->cwdcount - 1]);
      }
      break;

    case FTP_MDTM:
      result = ftp_state_mdtm_resp(data, ftpcode);
      break;

    case FTP_TYPE:
    case FTP_LIST_TYPE:
    case FTP_RETR_TYPE:
    case FTP_STOR_TYPE:
      result = ftp_state_type_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_SIZE:
    case FTP_RETR_SIZE:
    case FTP_STOR_SIZE:
      result = ftp_state_size_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_REST:
    case FTP_RETR_REST:
      result = ftp_state_rest_resp(data, conn, ftpcode, ftpc->state);
      break;

    case FTP_PRET:
      if(ftpcode != 200) {
        /* there only is this one standard OK return code. */
        failf(data, "PRET command not accepted: %03d", ftpcode);
        return CURLE_FTP_PRET_FAILED;
      }
      result = ftp_state_use_pasv(data, conn);
      break;

    case FTP_PASV:
      result = ftp_state_pasv_resp(data, ftpcode);
      break;

    case FTP_PORT:
      result = ftp_state_port_resp(data, ftpcode);
      break;

    case FTP_LIST:
    case FTP_RETR:
      result = ftp_state_get_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_STOR:
      result = ftp_state_stor_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(data, FTP_STOP);
      break;
    }
  } /* if(ftpcode) */

  return result;
}